

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

void __thiscall
rpn::CommandCallExpression::Evaluate(CommandCallExpression *this,EvaluationContext *context)

{
  size_t __n;
  const_iterator local_50;
  const_iterator local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  results_iterator local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argsBegin;
  iterator argsEnd;
  size_t evaluatedArity;
  EvaluationContext *context_local;
  CommandCallExpression *this_local;
  
  __n = EvaluateArity(this,&context->resultsCount);
  argsBegin._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 (&context->results);
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __gnu_cxx::
       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator-(&argsBegin,__n);
  std::__cxx11::string::clear();
  local_38 = local_30._M_current;
  local_40 = argsBegin._M_current;
  CallCommand(this,local_30,(results_iterator)argsBegin._M_current,&context->commandContext);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_48,&local_30);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_50,&argsBegin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&context->results,local_48,local_50);
  return;
}

Assistant:

void Evaluate(EvaluationContext& context) const final
    {
        const auto evaluatedArity = EvaluateArity(context.resultsCount);
        auto argsEnd = std::end(context.results);
        auto argsBegin = argsEnd - evaluatedArity;

        context.commandContext.result.clear();
        CallCommand(argsBegin, argsEnd, context.commandContext);

        context.results.erase(argsBegin, argsEnd);
    }